

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanMemoryManager.cpp
# Opt level: O2

void __thiscall VulkanUtilities::VulkanMemoryPage::~VulkanMemoryPage(VulkanMemoryPage *this)

{
  string msg;
  
  if (this->m_CPUMemory != (void *)0x0) {
    VulkanLogicalDevice::UnmapMemory
              (this->m_ParentMemoryMgr->m_LogicalDevice,(this->m_VkMemory).m_VkObject);
  }
  if ((this->m_AllocationMgr).m_FreeSize != (this->m_AllocationMgr).m_MaxSize) {
    Diligent::FormatString<char[52]>
              (&msg,(char (*) [52])"Destroying a page with not all allocations released");
    Diligent::DebugAssertionFailed
              (msg._M_dataplus._M_p,"~VulkanMemoryPage",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanMemoryManager.cpp"
               ,0x60);
    std::__cxx11::string::~string((string *)&msg);
  }
  VulkanObjectWrapper<VkDeviceMemory_T_*,_(VulkanUtilities::VulkanHandleTypeId)6>::
  ~VulkanObjectWrapper(&this->m_VkMemory);
  Diligent::VariableSizeAllocationsManager::~VariableSizeAllocationsManager(&this->m_AllocationMgr);
  return;
}

Assistant:

VulkanMemoryPage::~VulkanMemoryPage()
{
    if (m_CPUMemory != nullptr)
    {
        // Unmapping memory is not necessary, byt anyway
        m_ParentMemoryMgr.m_LogicalDevice.UnmapMemory(m_VkMemory);
    }

    VERIFY(IsEmpty(), "Destroying a page with not all allocations released");
}